

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkCollapse_rec(Cba_Ntk_t *pNew,Cba_Ntk_t *p,Vec_Int_t *vSigs)

{
  int iVar1;
  int iVar2;
  Cba_ObjType_t CVar3;
  int *a;
  Cba_Ntk_t *p_00;
  int local_34;
  int local_30;
  int iFon;
  int iFin;
  int iObjNew;
  int iObj;
  int i;
  Vec_Int_t *vSigs_local;
  Cba_Ntk_t *p_local;
  Cba_Ntk_t *pNew_local;
  
  Cba_NtkCleanObjCopies(p);
  Cba_NtkCleanFonCopies(p);
  iVar1 = Vec_IntSize(vSigs);
  iVar2 = Cba_NtkPiNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x2e3,"void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)");
  }
  for (iObjNew = 0; iVar1 = Cba_NtkPiNum(p), iObjNew < iVar1; iObjNew = iObjNew + 1) {
    iVar1 = Cba_NtkPi(p,iObjNew);
    iVar1 = Cba_ObjFon0(p,iVar1);
    iVar2 = Vec_IntEntry(vSigs,iObjNew);
    Cba_FonSetCopy(p,iVar1,iVar2);
  }
  for (iFin = 1; iVar1 = Vec_StrSize(&p->vObjType), iFin < iVar1; iFin = iFin + 1) {
    CVar3 = Cba_ObjType(p,iFin);
    if (CVar3 != CBA_OBJ_NONE) {
      iVar1 = Cba_ObjIsBoxPrim(p,iFin);
      if (iVar1 == 0) {
        iVar1 = Cba_ObjIsBoxUser(p,iFin);
        if (iVar1 != 0) {
          for (local_34 = Cba_ObjFon0(p,iFin); iVar1 = Cba_ObjFon0(p,iFin + 1), local_34 < iVar1;
              local_34 = local_34 + 1) {
            iVar1 = Cba_ObjAlloc(pNew,CBA_BOX_BUF,1,1);
            iVar1 = Cba_ObjFon0(pNew,iVar1);
            Cba_FonSetCopy(p,local_34,iVar1);
          }
        }
      }
      else {
        iVar1 = Cba_ObjDup(pNew,p,iFin);
        iObjNew = 0;
        for (local_34 = Cba_ObjFon0(p,iFin); iVar2 = Cba_ObjFon0(p,iFin + 1), local_34 < iVar2;
            local_34 = local_34 + 1) {
          iVar2 = Cba_ObjFon(pNew,iVar1,iObjNew);
          Cba_FonSetCopy(p,local_34,iVar2);
          iObjNew = iObjNew + 1;
        }
        iVar2 = Cba_ObjAttr(p,iFin);
        if (iVar2 != 0) {
          a = Cba_ObjAttrArray(p,iFin);
          iVar2 = Cba_ObjAttrSize(p,iFin);
          Cba_ObjSetAttrs(pNew,iVar1,a,iVar2);
        }
      }
    }
  }
  iFin = 1;
  do {
    iVar1 = Vec_StrSize(&p->vObjType);
    if (iVar1 <= iFin) {
      Vec_IntClear(vSigs);
      for (iObjNew = 0; iVar1 = Cba_NtkPoNum(p), iObjNew < iVar1; iObjNew = iObjNew + 1) {
        iVar1 = Cba_NtkPo(p,iObjNew);
        iVar1 = Cba_ObjFinFon(p,iVar1,0);
        iVar1 = Cba_FonCopy(p,iVar1);
        Vec_IntPush(vSigs,iVar1);
      }
      return;
    }
    CVar3 = Cba_ObjType(p,iFin);
    if (CVar3 != CBA_OBJ_NONE) {
      iVar1 = Cba_ObjIsBoxPrim(p,iFin);
      if (iVar1 == 0) {
        iVar1 = Cba_ObjIsBoxUser(p,iFin);
        if (iVar1 != 0) {
          Vec_IntClear(vSigs);
          for (local_30 = Cba_ObjFin0(p,iFin); iVar1 = Cba_ObjFin0(p,iFin + 1), local_30 < iVar1;
              local_30 = local_30 + 1) {
            iVar1 = Cba_FinFon(p,local_30);
            iVar1 = Cba_FonCopy(p,iVar1);
            Vec_IntPush(vSigs,iVar1);
          }
          iVar1 = Vec_IntSize(vSigs);
          iVar2 = Cba_ObjFinNum(p,iFin);
          if (iVar1 != iVar2) {
            __assert_fail("Vec_IntSize(vSigs) == Cba_ObjFinNum(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                          ,0x305,"void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)");
          }
          p_00 = Cba_ObjNtk(p,iFin);
          Cba_NtkCollapse_rec(pNew,p_00,vSigs);
          iVar1 = Vec_IntSize(vSigs);
          iVar2 = Cba_ObjFonNum(p,iFin);
          if (iVar1 != iVar2) {
            __assert_fail("Vec_IntSize(vSigs) == Cba_ObjFonNum(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                          ,0x307,"void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)");
          }
          iObjNew = 0;
          for (local_34 = Cba_ObjFon0(p,iFin); iVar1 = Cba_ObjFon0(p,iFin + 1), local_34 < iVar1;
              local_34 = local_34 + 1) {
            iVar1 = Cba_FonCopy(p,local_34);
            iVar1 = Cba_FonObj(pNew,iVar1);
            iVar2 = Vec_IntEntry(vSigs,iObjNew);
            Cba_ObjSetFinFon(pNew,iVar1,0,iVar2);
            iObjNew = iObjNew + 1;
          }
        }
      }
      else {
        iVar1 = Cba_ObjCopy(p,iFin);
        iObjNew = 0;
        for (local_30 = Cba_ObjFin0(p,iFin); iVar2 = Cba_ObjFin0(p,iFin + 1), local_30 < iVar2;
            local_30 = local_30 + 1) {
          iVar2 = Cba_FinFon(p,local_30);
          iVar2 = Cba_FonCopy(p,iVar2);
          Cba_ObjSetFinFon(pNew,iVar1,iObjNew,iVar2);
          iObjNew = iObjNew + 1;
        }
      }
    }
    iFin = iFin + 1;
  } while( true );
}

Assistant:

void Cba_NtkCollapse_rec( Cba_Ntk_t * pNew, Cba_Ntk_t * p, Vec_Int_t * vSigs )
{
    int i, iObj, iObjNew, iFin, iFon;
    Cba_NtkCleanObjCopies( p );
    Cba_NtkCleanFonCopies( p );
    // set PI copies
    assert( Vec_IntSize(vSigs) == Cba_NtkPiNum(p) );
    Cba_NtkForEachPiFon( p, iObj, iFon, i )
        Cba_FonSetCopy( p, iFon, Vec_IntEntry(vSigs, i) );
    // duplicate primitives and create buffers for user instances
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim( p, iObj ) )
        {
            iObjNew = Cba_ObjDup( pNew, p, iObj );
            Cba_ObjForEachFon( p, iObj, iFon, i )
                Cba_FonSetCopy( p, iFon, Cba_ObjFon(pNew, iObjNew, i) );
            if ( Cba_ObjAttr(p, iObj) )
                Cba_ObjSetAttrs( pNew, iObjNew, Cba_ObjAttrArray(p, iObj), Cba_ObjAttrSize(p, iObj) );
        }
        else if ( Cba_ObjIsBoxUser( p, iObj ) )
        {
            Cba_ObjForEachFon( p, iObj, iFon, i )
            {
                iObjNew = Cba_ObjAlloc( pNew, CBA_BOX_BUF, 1, 1 );
                Cba_FonSetCopy( p, iFon, Cba_ObjFon0(pNew, iObjNew) );
            }
        }
    // connect primitives and collapse user instances
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim( p, iObj ) )
        {
            iObjNew = Cba_ObjCopy( p, iObj );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
                Cba_ObjSetFinFon( pNew, iObjNew, i, Cba_FonCopy(p, iFon) );
        }
        else if ( Cba_ObjIsBoxUser( p, iObj ) )
        {
            Vec_IntClear( vSigs );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
                Vec_IntPush( vSigs, Cba_FonCopy(p, iFon) );
            assert( Vec_IntSize(vSigs) == Cba_ObjFinNum(p, iObj) );
            Cba_NtkCollapse_rec( pNew, Cba_ObjNtk(p, iObj), vSigs );
            assert( Vec_IntSize(vSigs) == Cba_ObjFonNum(p, iObj) );
            Cba_ObjForEachFon( p, iObj, iFon, i )
            {
                iObjNew = Cba_FonObj( pNew, Cba_FonCopy(p, iFon) ); // buffer
                Cba_ObjSetFinFon( pNew, iObjNew, 0, Vec_IntEntry(vSigs, i) );
            }
        }
    // collect POs
    Vec_IntClear( vSigs );
    Cba_NtkForEachPoDriverFon( p, iObj, iFon, i )
        Vec_IntPush( vSigs, Cba_FonCopy(p, iFon) );
}